

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O2

void Eigen::internal::gemv_dense_selector<2,1,true>::
     run<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Transpose<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>const>,Eigen::Transpose<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>>>
               (Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *lhs,
               Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *rhs,
               Transpose<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *dest,
               Scalar *alpha)

{
  size_t size;
  non_const_type pMVar1;
  non_const_type pMVar2;
  long cols;
  long rows;
  ResScalar *res;
  long resIncr;
  undefined8 alpha_00;
  double *pdVar3;
  double dStack_a8;
  BlockImpl_dense<Eigen::Transpose<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,__1,_1,_true,_true>
  local_a0;
  const_blas_data_mapper<double,_long,_1> local_68;
  const_blas_data_mapper<double,_long,_0> local_58;
  undefined1 local_48 [8];
  aligned_stack_memory_handler<double> actualRhsPtr_stack_memory_destructor;
  
  pMVar1 = lhs->m_matrix;
  pMVar2 = (rhs->m_matrix).m_matrix;
  actualRhsPtr_stack_memory_destructor._16_8_ = *alpha;
  actualRhsPtr_stack_memory_destructor.m_ptr =
       (double *)
       (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((ulong)actualRhsPtr_stack_memory_destructor.m_ptr >> 0x3d != 0) {
    throw_std_bad_alloc();
    actualRhsPtr_stack_memory_destructor.m_ptr =
         (double *)
         (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  }
  local_58.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
       (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  if (local_58.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data == (double *)0x0) {
    size = (long)actualRhsPtr_stack_memory_destructor.m_ptr * 8;
    if (size < 0x20001) {
      local_58.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
           (double *)((long)&dStack_a8 - (size + 0x1e & 0xfffffffffffffff0));
      local_48 = (undefined1  [8])
                 local_58.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
      pdVar3 = local_58.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
    }
    else {
      local_58.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
           (double *)aligned_malloc(size);
      actualRhsPtr_stack_memory_destructor.m_ptr =
           (double *)
           (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
      ;
      local_48 = (undefined1  [8])(double *)0x0;
      pdVar3 = &dStack_a8;
      if ((pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
          == (double *)0x0) {
        local_48 = (undefined1  [8])
                   local_58.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        pdVar3 = &dStack_a8;
      }
    }
  }
  else {
    local_48 = (undefined1  [8])(double *)0x0;
    pdVar3 = &dStack_a8;
  }
  actualRhsPtr_stack_memory_destructor.m_size._0_1_ =
       0x20000 < (ulong)((long)actualRhsPtr_stack_memory_destructor.m_ptr * 8);
  cols = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
  ;
  rows = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
  ;
  local_68.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data =
       (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  local_58.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride = 1;
  res = (((dest->m_matrix).m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
        ).m_storage.m_data;
  local_68.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride = cols;
  pdVar3[-1] = 6.24124474583788e-318;
  BlockImpl_dense<Eigen::Transpose<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_-1,_1,_true,_true>
  ::BlockImpl_dense(&local_a0,dest,0);
  pdVar3[-1] = 4.94065645841247e-324;
  alpha_00 = actualRhsPtr_stack_memory_destructor._16_8_;
  resIncr = (long)pdVar3[-1];
  pdVar3[-1] = 6.24139790618809e-318;
  general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_1,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_false,_0>
  ::run(rows,cols,&local_68,&local_58,res,resIncr,(ResScalar)alpha_00);
  pdVar3[-1] = 6.24144237209622e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_48);
  return;
}

Assistant:

static void run(const Lhs &lhs, const Rhs &rhs, Dest& dest, const typename Dest::Scalar& alpha)
  {
    typedef typename Lhs::Scalar   LhsScalar;
    typedef typename Rhs::Scalar   RhsScalar;
    typedef typename Dest::Scalar  ResScalar;
    
    typedef internal::blas_traits<Lhs> LhsBlasTraits;
    typedef typename LhsBlasTraits::DirectLinearAccessType ActualLhsType;
    typedef internal::blas_traits<Rhs> RhsBlasTraits;
    typedef typename RhsBlasTraits::DirectLinearAccessType ActualRhsType;
    typedef typename internal::remove_all<ActualRhsType>::type ActualRhsTypeCleaned;

    typename add_const<ActualLhsType>::type actualLhs = LhsBlasTraits::extract(lhs);
    typename add_const<ActualRhsType>::type actualRhs = RhsBlasTraits::extract(rhs);

    ResScalar actualAlpha = combine_scalar_factors(alpha, lhs, rhs);

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      DirectlyUseRhs = ActualRhsTypeCleaned::InnerStrideAtCompileTime==1 || ActualRhsTypeCleaned::MaxSizeAtCompileTime==0
    };

    gemv_static_vector_if<RhsScalar,ActualRhsTypeCleaned::SizeAtCompileTime,ActualRhsTypeCleaned::MaxSizeAtCompileTime,!DirectlyUseRhs> static_rhs;

    ei_declare_aligned_stack_constructed_variable(RhsScalar,actualRhsPtr,actualRhs.size(),
        DirectlyUseRhs ? const_cast<RhsScalar*>(actualRhs.data()) : static_rhs.data());

    if(!DirectlyUseRhs)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      Index size = actualRhs.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      Map<typename ActualRhsTypeCleaned::PlainObject>(actualRhsPtr, actualRhs.size()) = actualRhs;
    }

    typedef const_blas_data_mapper<LhsScalar,Index,RowMajor> LhsMapper;
    typedef const_blas_data_mapper<RhsScalar,Index,ColMajor> RhsMapper;
    general_matrix_vector_product
        <Index,LhsScalar,LhsMapper,RowMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsMapper,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        LhsMapper(actualLhs.data(), actualLhs.outerStride()),
        RhsMapper(actualRhsPtr, 1),
        dest.data(), dest.col(0).innerStride(), //NOTE  if dest is not a vector at compile-time, then dest.innerStride() might be wrong. (bug 1166)
        actualAlpha);
  }